

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it
          )

{
  bool in_R8B;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> local_30;
  
  internal::
  format_uint<1u,char,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long>
            (&local_30,*(internal **)this,*it,(ulong)*(uint *)(this + 8),0,in_R8B);
  *(ulong *)((long)&(it->super_truncating_iterator_base<char_*>).limit_ + 1) =
       CONCAT17((undefined1)local_30.super_truncating_iterator_base<char_*>.count_,
                local_30.super_truncating_iterator_base<char_*>.limit_._1_7_);
  *(undefined8 *)((long)&(it->super_truncating_iterator_base<char_*>).count_ + 1) = local_30._17_8_;
  (it->super_truncating_iterator_base<char_*>).out_ =
       local_30.super_truncating_iterator_base<char_*>.out_;
  (it->super_truncating_iterator_base<char_*>).limit_ =
       CONCAT71(local_30.super_truncating_iterator_base<char_*>.limit_._1_7_,
                (undefined1)local_30.super_truncating_iterator_base<char_*>.limit_);
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }